

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
          (CodedInputStream *this,uint32_t *value)

{
  bool bVar1;
  uint32_t *buffer;
  uint8_t bytes [4];
  uint32_t local_14;
  
  buffer = (uint32_t *)this->buffer_;
  if (*(int *)&this->buffer_end_ - (int)buffer < 4) {
    buffer = &local_14;
    bVar1 = ReadRaw(this,buffer,4);
    if (!bVar1) {
      return false;
    }
  }
  else {
    this->buffer_ = (uint8_t *)(buffer + 1);
  }
  *value = *buffer;
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian32Fallback(uint32_t* value) {
  uint8_t bytes[sizeof(*value)];

  const uint8_t* ptr;
  if (BufferSize() >= static_cast<int64_t>(sizeof(*value))) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian32FromArray(ptr, value);
  return true;
}